

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_12::PathVerifier::VerifyPolicies
          (PathVerifier *this,ParsedCertificate *cert,bool is_target_cert,CertErrors *errors)

{
  pointer pmVar1;
  Span<const_unsigned_char> *pSVar2;
  Span<const_unsigned_char> policy;
  Input lhs;
  Input rhs;
  Input policy_00;
  Input policy_01;
  bool bVar3;
  bool bVar4;
  iterator __position;
  _Base_ptr p_Var5;
  bool bVar6;
  undefined7 in_register_00000011;
  Span<const_unsigned_char> *pSVar7;
  Input rhs_00;
  Input p_oid;
  LevelDetails previous_level;
  key_type local_e8;
  undefined4 local_cc;
  CertErrors *local_c8;
  ParsedCertificate *local_c0;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_b8;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_a0;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_88;
  LevelDetails local_68;
  
  if ((cert->has_policy_oids_ == true) &&
     (((this->valid_policy_graph_).current_level_.has_any_policy != false ||
      ((pmVar1 = (this->valid_policy_graph_).levels_.
                 super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
       (this->valid_policy_graph_).levels_.
       super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start != pmVar1 &&
       (pmVar1[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)))))) {
    local_cc = (undefined4)CONCAT71(in_register_00000011,is_target_cert);
    ValidPolicyGraph::StartLevel(&local_68,&this->valid_policy_graph_);
    if (cert->has_policy_oids_ == false) {
      abort();
    }
    pSVar7 = &((cert->policy_oids_).
               super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
               super__Vector_impl_data._M_start)->data_;
    pSVar2 = &((cert->policy_oids_).
               super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
               super__Vector_impl_data._M_finish)->data_;
    local_c0 = cert;
    if (pSVar7 != pSVar2) {
      local_c8 = errors;
      bVar4 = false;
      do {
        local_e8.data_.data_ = pSVar7->data_;
        local_e8.data_.size_ = pSVar7->size_;
        rhs_00.data_.size_ = 4;
        rhs_00.data_.data_ = "U\x1d ";
        bVar3 = bssl::der::operator==((Input)*pSVar7,rhs_00);
        bVar6 = true;
        if (!bVar3) {
          __position = ::std::
                       _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                       ::find((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                               *)&local_68,&local_e8);
          bVar6 = bVar4;
          if ((_Rb_tree_header *)__position._M_node ==
              &local_68.expected_policy_map._M_t._M_impl.super__Rb_tree_header) {
            if (local_68.has_any_policy == true) {
              policy_01.data_.size_ = local_e8.data_.size_;
              policy_01.data_.data_ = local_e8.data_.data_;
              local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ValidPolicyGraph::AddNode(&this->valid_policy_graph_,policy_01,&local_88);
              if (local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_88.
                                super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_88.
                                      super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_88.
                                      super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
          }
          else {
            policy_00.data_.size_ = local_e8.data_.size_;
            policy_00.data_.data_ = local_e8.data_.data_;
            local_a0.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)__position._M_node[1]._M_left;
            local_a0.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)__position._M_node[1]._M_right;
            local_a0.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = *(pointer *)(__position._M_node + 2);
            __position._M_node[1]._M_left = (_Base_ptr)0x0;
            __position._M_node[1]._M_right = (_Base_ptr)0x0;
            *(undefined8 *)(__position._M_node + 2) = 0;
            ValidPolicyGraph::AddNode(&this->valid_policy_graph_,policy_00,&local_a0);
            if ((_Base_ptr)
                local_a0.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                _M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
              operator_delete(local_a0.
                              super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_a0.
                                    super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_a0.
                                    super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            ::std::
            _Rb_tree<bssl::der::Input,std::pair<bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>,std::_Select1st<std::pair<bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>>,std::less<bssl::der::Input>,std::allocator<std::pair<bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>>>
            ::erase_abi_cxx11_((_Rb_tree<bssl::der::Input,std::pair<bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>,std::_Select1st<std::pair<bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>>,std::less<bssl::der::Input>,std::allocator<std::pair<bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>>>
                                *)&local_68,__position);
          }
        }
        errors = local_c8;
        pSVar7 = pSVar7 + 1;
        bVar4 = bVar6;
      } while (pSVar7 != pSVar2);
      if ((bVar6) &&
         ((this->inhibit_any_policy_ != 0 ||
          (((char)local_cc == '\0' &&
           (lhs.data_.data_ = *(uchar **)&(local_c0->normalized_subject_)._M_dataplus,
           lhs.data_.size_ = (local_c0->normalized_subject_)._M_string_length,
           rhs.data_.data_ = *(uchar **)&(local_c0->normalized_issuer_)._M_dataplus,
           rhs.data_.size_ = (local_c0->normalized_issuer_)._M_string_length,
           bVar4 = bssl::der::operator==(lhs,rhs), bVar4)))))) {
        if ((_Rb_tree_header *)
            local_68.expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_68.expected_policy_map._M_t._M_impl.super__Rb_tree_header) {
          p_Var5 = local_68.expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ;
          do {
            policy = *(Span<const_unsigned_char> *)(p_Var5 + 1);
            local_b8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)p_Var5[1]._M_left;
            local_b8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)p_Var5[1]._M_right;
            local_b8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = *(pointer *)(p_Var5 + 2);
            p_Var5[1]._M_left = (_Base_ptr)0x0;
            p_Var5[1]._M_right = (_Base_ptr)0x0;
            *(undefined8 *)(p_Var5 + 2) = 0;
            ValidPolicyGraph::AddNode(&this->valid_policy_graph_,(Input)policy,&local_b8);
            if ((_Base_ptr)
                local_b8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                _M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
              operator_delete(local_b8.
                              super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_b8.
                                    super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_b8.
                                    super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            p_Var5 = (_Base_ptr)::std::_Rb_tree_increment(p_Var5);
          } while ((_Rb_tree_header *)p_Var5 !=
                   &local_68.expected_policy_map._M_t._M_impl.super__Rb_tree_header);
        }
        errors = local_c8;
        if (local_68.has_any_policy != false) {
          if ((this->valid_policy_graph_).levels_.
              super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (this->valid_policy_graph_).levels_.
              super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            __assert_fail("!levels_.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                          ,0x28d,
                          "void bssl::(anonymous namespace)::ValidPolicyGraph::AddAnyPolicyNode()");
          }
          (this->valid_policy_graph_).current_level_.has_any_policy = true;
        }
      }
    }
    ::std::
    _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                 *)&local_68);
    cert = local_c0;
  }
  if (cert->has_policy_oids_ == false) {
    ValidPolicyGraph::SetNull(&this->valid_policy_graph_);
  }
  if (((this->explicit_policy_ == 0) &&
      ((this->valid_policy_graph_).current_level_.has_any_policy == false)) &&
     ((pmVar1 = (this->valid_policy_graph_).levels_.
                super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      (this->valid_policy_graph_).levels_.
      super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == pmVar1 ||
      (pmVar1[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) {
    CertErrors::AddError(errors,"No valid policy");
  }
  return;
}

Assistant:

void PathVerifier::VerifyPolicies(const ParsedCertificate &cert,
                                  bool is_target_cert, CertErrors *errors) {
  // From RFC 5280 section 6.1.3:
  //
  //  (d)  If the certificate policies extension is present in the
  //       certificate and the valid_policy_tree is not NULL, process
  //       the policy information by performing the following steps in
  //       order:
  if (cert.has_policy_oids() && !valid_policy_graph_.IsNull()) {
    ValidPolicyGraph::LevelDetails previous_level =
        valid_policy_graph_.StartLevel();

    //     (1)  For each policy P not equal to anyPolicy in the
    //          certificate policies extension, let P-OID denote the OID
    //          for policy P and P-Q denote the qualifier set for policy
    //          P.  Perform the following steps in order:
    bool cert_has_any_policy = false;
    for (der::Input p_oid : cert.policy_oids()) {
      if (p_oid == der::Input(kAnyPolicyOid)) {
        cert_has_any_policy = true;
        continue;
      }

      //        (i)   For each node of depth i-1 in the valid_policy_tree
      //              where P-OID is in the expected_policy_set, create a
      //              child node as follows: set the valid_policy to P-OID,
      //              set the qualifier_set to P-Q, and set the
      //              expected_policy_set to {P-OID}.
      auto iter = previous_level.expected_policy_map.find(p_oid);
      if (iter != previous_level.expected_policy_map.end()) {
        valid_policy_graph_.AddNode(
            p_oid, /*parent_policies=*/std::move(iter->second));
        previous_level.expected_policy_map.erase(iter);
      } else if (previous_level.has_any_policy) {
        //      (ii)  If there was no match in step (i) and the
        //            valid_policy_tree includes a node of depth i-1 with
        //            the valid_policy anyPolicy, generate a child node with
        //            the following values: set the valid_policy to P-OID,
        //            set the qualifier_set to P-Q, and set the
        //            expected_policy_set to  {P-OID}.
        valid_policy_graph_.AddNodeWithParentAnyPolicy(p_oid);
      }
    }

    //     (2)  If the certificate policies extension includes the policy
    //          anyPolicy with the qualifier set AP-Q and either (a)
    //          inhibit_anyPolicy is greater than 0 or (b) i<n and the
    //          certificate is self-issued, then:
    //
    //          For each node in the valid_policy_tree of depth i-1, for
    //          each value in the expected_policy_set (including
    //          anyPolicy) that does not appear in a child node, create a
    //          child node with the following values: set the valid_policy
    //          to the value from the expected_policy_set in the parent
    //          node, set the qualifier_set to AP-Q, and set the
    //          expected_policy_set to the value in the valid_policy from
    //          this node.
    if (cert_has_any_policy && ((inhibit_any_policy_ > 0) ||
                                (!is_target_cert && IsSelfIssued(cert)))) {
      for (auto &[p_oid, parent_policies] :
           previous_level.expected_policy_map) {
        valid_policy_graph_.AddNode(p_oid, std::move(parent_policies));
      }
      if (previous_level.has_any_policy) {
        valid_policy_graph_.AddAnyPolicyNode();
      }
    }

    //     (3)  If there is a node in the valid_policy_tree of depth i-1
    //          or less without any child nodes, delete that node.  Repeat
    //          this step until there are no nodes of depth i-1 or less
    //          without children.
    //
    // This implementation does this as part of GetUserConstrainedPolicySet().
    // Only the current level needs to be pruned to compute the policy graph.
  }

  //  (e)  If the certificate policies extension is not present, set the
  //       valid_policy_tree to NULL.
  if (!cert.has_policy_oids()) {
    valid_policy_graph_.SetNull();
  }

  //  (f)  Verify that either explicit_policy is greater than 0 or the
  //       valid_policy_tree is not equal to NULL;
  if (!((explicit_policy_ > 0) || !valid_policy_graph_.IsNull())) {
    errors->AddError(cert_errors::kNoValidPolicy);
  }
}